

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode Curl_auth_create_digest_http_message
                   (Curl_easy *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen)

{
  digestdata *digest_local;
  uchar *uripath_local;
  uchar *request_local;
  char *passwdp_local;
  char *userp_local;
  Curl_easy *data_local;
  
  if (digest->algo < 2) {
    data_local._4_4_ =
         auth_create_digest_http_message
                   (data,userp,passwdp,request,uripath,digest,outptr,outlen,auth_digest_md5_to_ascii
                    ,Curl_md5it);
  }
  else if (digest->algo < 4) {
    data_local._4_4_ =
         auth_create_digest_http_message
                   (data,userp,passwdp,request,uripath,digest,outptr,outlen,
                    auth_digest_sha256_to_ascii,Curl_sha256it);
  }
  else if (digest->algo < 6) {
    data_local._4_4_ =
         auth_create_digest_http_message
                   (data,userp,passwdp,request,uripath,digest,outptr,outlen,
                    auth_digest_sha256_to_ascii,Curl_sha512_256it);
  }
  else {
    data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_digest_http_message(struct Curl_easy *data,
                                              const char *userp,
                                              const char *passwdp,
                                              const unsigned char *request,
                                              const unsigned char *uripath,
                                              struct digestdata *digest,
                                              char **outptr, size_t *outlen)
{
  if(digest->algo <= ALGO_MD5SESS)
    return auth_create_digest_http_message(data, userp, passwdp,
                                           request, uripath, digest,
                                           outptr, outlen,
                                           auth_digest_md5_to_ascii,
                                           Curl_md5it);

  if(digest->algo <= ALGO_SHA256SESS)
    return auth_create_digest_http_message(data, userp, passwdp,
                                           request, uripath, digest,
                                           outptr, outlen,
                                           auth_digest_sha256_to_ascii,
                                           Curl_sha256it);
#ifdef CURL_HAVE_SHA512_256
  if(digest->algo <= ALGO_SHA512_256SESS)
    return auth_create_digest_http_message(data, userp, passwdp,
                                           request, uripath, digest,
                                           outptr, outlen,
                                           auth_digest_sha256_to_ascii,
                                           Curl_sha512_256it);
#endif /* CURL_HAVE_SHA512_256 */

  /* Should be unreachable */
  return CURLE_BAD_CONTENT_ENCODING;
}